

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*>::
emplaceRealloc<slang::syntax::ConfigInstanceIdentifierSyntax*>
          (SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *this,pointer pos,
          ConfigInstanceIdentifierSyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppCVar3;
  ConfigInstanceIdentifierSyntax **__result;
  ConfigInstanceIdentifierSyntax **ppCVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  ConfigInstanceIdentifierSyntax **args_local;
  pointer pos_local;
  SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::max_size
                    ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::calculateGrowth
                       ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this,
                        *(long *)(this + 8) + 1);
  ppCVar3 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::begin
                      ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this);
  __result = (ConfigInstanceIdentifierSyntax **)slang::detail::allocArray(capacity,8);
  ppCVar4 = __result + ((long)pos - (long)ppCVar3 >> 3);
  *ppCVar4 = *args;
  ppCVar3 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::end
                      ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this);
  if (pos == ppCVar3) {
    ppCVar3 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::ConfigInstanceIdentifierSyntax**,slang::syntax::ConfigInstanceIdentifierSyntax**>
              (ppCVar3,(ConfigInstanceIdentifierSyntax **)ctx,__result);
  }
  else {
    ppCVar3 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::ConfigInstanceIdentifierSyntax**,slang::syntax::ConfigInstanceIdentifierSyntax**>
              (ppCVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::ConfigInstanceIdentifierSyntax**,slang::syntax::ConfigInstanceIdentifierSyntax**>
              (pos,(ConfigInstanceIdentifierSyntax **)ctx,ppCVar4 + 1);
  }
  SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::cleanup
            ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(ConfigInstanceIdentifierSyntax ***)this = __result;
  return ppCVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}